

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O0

void place_trap(chunk_conflict2 *c,loc_conflict grid,wchar_t t_idx,wchar_t trap_level)

{
  _Bool _Var1;
  int iVar2;
  square_conflict *psVar3;
  trap *trap;
  trap *ptVar4;
  trap *new_trap;
  wchar_t trap_level_local;
  wchar_t t_idx_local;
  chunk_conflict2 *c_local;
  loc_conflict grid_local;
  
  if ((t_idx < L'\x01') || (new_trap._4_4_ = t_idx, (int)(uint)z_info->trap_max <= t_idx)) {
    _Var1 = square_player_trap_allowed(c,grid);
    if (!_Var1) {
      return;
    }
    psVar3 = square((chunk *)c,grid);
    new_trap._4_4_ = pick_trap(c,(uint)psVar3->feat,trap_level);
  }
  if ((L'\xffffffff' < new_trap._4_4_) &&
     ((((player == (player *)0x0 || (player->upkeep == (player_upkeep *)0x0)) ||
       ((player->upkeep->arena_level & 1U) == 0)) ||
      (_Var1 = flag_has_dbg(trap_info[new_trap._4_4_].flags,3,7,"trap_info[t_idx].flags","TRF_DOWN")
      , !_Var1)))) {
    trap = (trap *)mem_zalloc(0x28);
    ptVar4 = square_trap((chunk *)c,grid);
    trap->next = ptVar4;
    square_set_trap((chunk *)c,grid,trap);
    trap->t_idx = (uint8_t)new_trap._4_4_;
    trap->kind = trap_info + new_trap._4_4_;
    trap->grid = grid;
    iVar2 = randcalc((random_value)trap->kind->power,trap_level,RANDOMISE);
    trap->power = (uint8_t)iVar2;
    flag_copy(trap->flags,trap_info[new_trap._4_4_].flags,3);
    _Var1 = flag_has_dbg(trap->flags,3,0x10,"new_trap->flags","TRF_M_TRAP");
    if (_Var1) {
      player->num_traps = player->num_traps + '\x01';
    }
    psVar3 = square((chunk *)c,grid);
    flag_on_dbg(psVar3->info,3,9,"square(c, grid)->info","SQUARE_TRAP");
    square_note_spot((chunk *)c,(loc)grid);
    square_light_spot((chunk *)c,(loc)grid);
  }
  return;
}

Assistant:

void place_trap(struct chunk *c, struct loc grid, int t_idx, int trap_level)
{
	struct trap *new_trap;

	/* We've been called with an illegal index; choose a random trap */
	if ((t_idx <= 0) || (t_idx >= z_info->trap_max)) {
		/* Require the correct terrain */
		if (!square_player_trap_allowed(c, grid)) return;

		t_idx = pick_trap(c, square(c, grid)->feat, trap_level);
	}

	/* Failure */
	if (t_idx < 0) return;
	/* Don't allow trap doors in single combat arenas. */
	if (player && player->upkeep && player->upkeep->arena_level
			&& trf_has(trap_info[t_idx].flags, TRF_DOWN)) {
		return;
	}

	/* Allocate a new trap for this grid (at the front of the list) */
	new_trap = mem_zalloc(sizeof(*new_trap));
	new_trap->next = square_trap(c, grid);
	square_set_trap(c, grid, new_trap);

	/* Set the details */
	new_trap->t_idx = t_idx;
	new_trap->kind = &trap_info[t_idx];
	new_trap->grid = grid;
	new_trap->power = randcalc(new_trap->kind->power, trap_level, RANDOMISE);
	trf_copy(new_trap->flags, trap_info[t_idx].flags);

	/* We created a monster trap */
	if (trf_has(new_trap->flags, TRF_M_TRAP)) {
		player->num_traps++;
	}

	/* Toggle on the trap marker */
	sqinfo_on(square(c, grid)->info, SQUARE_TRAP);

	/* Redraw the grid */
	square_note_spot(c, grid);
	square_light_spot(c, grid);
}